

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__handle_clipped_edge
               (float *scanline,int x,stbtt__active_edge *e,float x0,float y0,float x1,float y1)

{
  bool bVar1;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  
  if ((in_XMM1_Da != in_XMM3_Da) || (NAN(in_XMM1_Da) || NAN(in_XMM3_Da))) {
    if (in_XMM3_Da <= in_XMM1_Da) {
      __assert_fail("y0 < y1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                    ,0xb7b,
                    "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                   );
    }
    if (*(float *)(in_RDX + 0x1c) < *(float *)(in_RDX + 0x18)) {
      __assert_fail("e->sy <= e->ey",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                    ,0xb7c,
                    "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                   );
    }
    if ((in_XMM1_Da <= *(float *)(in_RDX + 0x1c)) && (*(float *)(in_RDX + 0x18) <= in_XMM3_Da)) {
      local_20 = in_XMM1_Da;
      local_1c = in_XMM0_Da;
      if (in_XMM1_Da < *(float *)(in_RDX + 0x18)) {
        local_1c = ((in_XMM2_Da - in_XMM0_Da) * (*(float *)(in_RDX + 0x18) - in_XMM1_Da)) /
                   (in_XMM3_Da - in_XMM1_Da) + in_XMM0_Da;
        local_20 = *(float *)(in_RDX + 0x18);
      }
      local_28 = in_XMM3_Da;
      local_24 = in_XMM2_Da;
      if (*(float *)(in_RDX + 0x1c) < in_XMM3_Da) {
        local_24 = ((in_XMM2_Da - local_1c) * (*(float *)(in_RDX + 0x1c) - in_XMM3_Da)) /
                   (in_XMM3_Da - local_20) + in_XMM2_Da;
        local_28 = *(float *)(in_RDX + 0x1c);
      }
      if ((local_1c != (float)in_ESI) || (NAN(local_1c) || NAN((float)in_ESI))) {
        if ((local_1c != (float)(in_ESI + 1)) || (NAN(local_1c) || NAN((float)(in_ESI + 1)))) {
          if ((float)in_ESI < local_1c) {
            if (local_1c < (float)(in_ESI + 1)) {
              if (local_24 < (float)in_ESI || (float)(in_ESI + 1) < local_24) {
                __assert_fail("x1 >= x && x1 <= x+1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                              ,0xb91,
                              "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                             );
              }
            }
            else if (local_24 < (float)(in_ESI + 1)) {
              __assert_fail("x1 >= x+1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                            ,0xb8f,
                            "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                           );
            }
          }
          else if ((float)in_ESI < local_24) {
            __assert_fail("x1 <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                          ,0xb8d,
                          "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                         );
          }
        }
        else if (local_24 < (float)in_ESI) {
          __assert_fail("x1 >= x",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                        ,0xb8b,
                        "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                       );
        }
      }
      else if ((float)(in_ESI + 1) < local_24) {
        __assert_fail("x1 <= x+1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                      ,0xb89,
                      "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                     );
      }
      if (((float)in_ESI < local_1c) || ((float)in_ESI < local_24)) {
        if ((local_1c < (float)(in_ESI + 1)) || (local_24 < (float)(in_ESI + 1))) {
          bVar1 = false;
          if ((((float)in_ESI <= local_1c) && (bVar1 = false, local_1c <= (float)(in_ESI + 1))) &&
             (bVar1 = false, (float)in_ESI <= local_24)) {
            bVar1 = local_24 <= (float)(in_ESI + 1);
          }
          if (!bVar1) {
            __assert_fail("x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                          ,0xb98,
                          "void stbtt__handle_clipped_edge(float *, int, stbtt__active_edge *, float, float, float, float)"
                         );
          }
          *(float *)(in_RDI + (long)in_ESI * 4) =
               *(float *)(in_RDX + 0x14) * (local_28 - local_20) *
               (1.0 - ((local_1c - (float)in_ESI) + (local_24 - (float)in_ESI)) / 2.0) +
               *(float *)(in_RDI + (long)in_ESI * 4);
        }
      }
      else {
        *(float *)(in_RDI + (long)in_ESI * 4) =
             *(float *)(in_RDX + 0x14) * (local_28 - local_20) +
             *(float *)(in_RDI + (long)in_ESI * 4);
      }
    }
  }
  return;
}

Assistant:

static void stbtt__handle_clipped_edge(float *scanline, int x, stbtt__active_edge *e, float x0, float y0, float x1, float y1)
{
   if (y0 == y1) return;
   STBTT_assert(y0 < y1);
   STBTT_assert(e->sy <= e->ey);
   if (y0 > e->ey) return;
   if (y1 < e->sy) return;
   if (y0 < e->sy) {
      x0 += (x1-x0) * (e->sy - y0) / (y1-y0);
      y0 = e->sy;
   }
   if (y1 > e->ey) {
      x1 += (x1-x0) * (e->ey - y1) / (y1-y0);
      y1 = e->ey;
   }

   if (x0 == x)
      STBTT_assert(x1 <= x+1);
   else if (x0 == x+1)
      STBTT_assert(x1 >= x);
   else if (x0 <= x)
      STBTT_assert(x1 <= x);
   else if (x0 >= x+1)
      STBTT_assert(x1 >= x+1);
   else
      STBTT_assert(x1 >= x && x1 <= x+1);

   if (x0 <= x && x1 <= x)
      scanline[x] += e->direction * (y1-y0);
   else if (x0 >= x+1 && x1 >= x+1)
      ;
   else {
      STBTT_assert(x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1);
      scanline[x] += e->direction * (y1-y0) * (1-((x0-x)+(x1-x))/2); // coverage = 1 - average x position
   }
}